

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTestPluginManager.cpp
# Opt level: O2

void __thiscall
TestPluginManager_statefulPluginReload_Test::TestBody
          (TestPluginManager_statefulPluginReload_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *__p;
  undefined4 uVar1;
  char *pcVar2;
  _func_int **pp_Var3;
  char *in_R9;
  AssertHelper local_80;
  AssertionResult gtest_ar_2;
  shared_ptr<plugin::interfaces::IStatefulPluginInterface> sp2;
  AssertHelper local_58;
  __single_object pm;
  int testValue;
  shared_ptr<plugin::interfaces::IStatefulPluginInterface> sp;
  weak_ptr<plugin::interfaces::IStatefulPluginInterface> wp;
  
  std::make_unique<plugin::PluginManager,char_const(&)[26]>((char (*) [26])&pm);
  plugin::helpers::
  GetSinglePlugin<plugin::interfaces::IStatefulPluginInterface,plugin::interfaces::IStatefulPluginInterface>
            ((helpers *)&sp,
             (PluginManager *)
             pm._M_t.
             super___uniq_ptr_impl<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_plugin::PluginManager_*,_std::default_delete<plugin::PluginManager>_>
             .super__Head_base<0UL,_plugin::PluginManager_*,_false>._M_head_impl);
  std::__weak_ptr<plugin::interfaces::IStatefulPluginInterface,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<plugin::interfaces::IStatefulPluginInterface,void>
            ((__weak_ptr<plugin::interfaces::IStatefulPluginInterface,(__gnu_cxx::_Lock_policy)2> *)
             &wp,&sp.
                  super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sp.
              super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&sp.
                super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
               ,(__weak_ptr<plugin::interfaces::IStatefulPluginInterface,(__gnu_cxx::_Lock_policy)2>
                 *)&wp);
  gtest_ar_2._0_4_ =
       (**(code **)(*(long *)sp.
                             super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 0x28))();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&sp2,"plugin::interfaces::IStatefulPluginInterface::DEFAULT_VALUE",
             "sp->GetNumber()",&plugin::interfaces::IStatefulPluginInterface::DEFAULT_VALUE,
             (int *)&gtest_ar_2);
  if ((char)sp2.
            super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    std::operator<<((ostream *)(CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 0x10),
                    "The initial value is not what was expected");
    if (sp2.
        super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x14c280;
    }
    else {
      pp_Var3 = (sp2.
                 super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x82,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sp2.
                    super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  testValue = 0x2a;
  (**(code **)(*(long *)sp.
                        super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x20))
            (sp.
             super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x2a);
  gtest_ar_2._0_4_ =
       (**(code **)(*(long *)sp.
                             super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 0x28))();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&sp2,"testValue","sp->GetNumber()",&testValue,(int *)&gtest_ar_2);
  if ((char)sp2.
            super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    std::operator<<((ostream *)(CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 0x10),
                    "The new value is not what was expected");
    if (sp2.
        super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x14c280;
    }
    else {
      pp_Var3 = (sp2.
                 super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x86,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sp2.
                    super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  plugin::helpers::
  GetSinglePlugin<plugin::interfaces::IStatefulPluginInterface,plugin::interfaces::IStatefulPluginInterface>
            ((helpers *)&sp2,
             (PluginManager *)
             pm._M_t.
             super___uniq_ptr_impl<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_plugin::PluginManager_*,_std::default_delete<plugin::PluginManager>_>
             .super__Head_base<0UL,_plugin::PluginManager_*,_false>._M_head_impl);
  local_80.data_ =
       (AssertHelperData *)
       sp.
       super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  testing::internal::
  CmpHelperEQ<plugin::interfaces::IStatefulPluginInterface*,plugin::interfaces::IStatefulPluginInterface*>
            ((internal *)&gtest_ar_2,"sp.get()","sp2.get()",(IStatefulPluginInterface **)&local_80,
             (IStatefulPluginInterface **)&local_58);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    std::operator<<((ostream *)&(local_80.data_)->line,
                    "Getting the interface again does NOT return the same shared pointer");
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_80.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  uVar1 = (**(code **)(*(long *)CONCAT71(sp2.
                                         super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._1_7_,
                                         (char)sp2.
                                               super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr) + 0x28))();
  local_80.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_2,"testValue","sp2->GetNumber()",&testValue,(int *)&local_80);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    std::operator<<((ostream *)&(local_80.data_)->line,
                    "Getting another pointer to the same interface does NOT give the same internal state"
                   );
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_80.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  this_00 = &sp2.
             super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sp.
              super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (wp.super___weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    sp2.super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_1_ = false;
  }
  else {
    sp2.super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sp2.super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_1_ =
         (wp.
          super___weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi)->_M_use_count != 0;
    if ((bool)(char)sp2.
                    super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr) goto LAB_0011c2eb;
  }
  sp2.super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  testing::Message::Message((Message *)&gtest_ar_2);
  std::operator<<((ostream *)(CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 0x10),
                  "The plugin object was deleted, but should still exist.");
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&sp,(internal *)&sp2,(AssertionResult *)"wp.expired()","true","false",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
             ,0x8d,(char *)sp.
                           super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_2);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  std::__cxx11::string::~string((string *)&sp);
  if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
  }
LAB_0011c2eb:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  std::__uniq_ptr_impl<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>::reset
            ((__uniq_ptr_impl<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_> *)
             &pm,(pointer)0x0);
  if (wp.super___weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    sp2.super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_1_ = '\x01';
    sp2.super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    sp2.super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sp2.super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_1_ =
         (wp.
          super___weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi)->_M_use_count == 0;
    if (!(bool)(char)sp2.
                     super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr) {
      testing::Message::Message((Message *)&gtest_ar_2);
      std::operator<<((ostream *)(CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 0x10),
                      "The plugin object WAS NOT deleted after unloading the plugin manager.");
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&sp,(internal *)&sp2,(AssertionResult *)"wp.expired()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
                 ,0x91,(char *)sp.
                               super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_2);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      std::__cxx11::string::~string((string *)&sp);
      if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sp2.
                    super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  std::make_unique<plugin::PluginManager,char_const(&)[26]>((char (*) [26])&sp);
  __p = sp.
        super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr;
  sp.super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  std::__uniq_ptr_impl<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>::reset
            ((__uniq_ptr_impl<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_> *)
             &pm,(pointer)__p);
  std::unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>::~unique_ptr
            ((unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_> *)&sp);
  plugin::helpers::
  GetSinglePlugin<plugin::interfaces::IStatefulPluginInterface,plugin::interfaces::IStatefulPluginInterface>
            ((helpers *)&sp,
             (PluginManager *)
             pm._M_t.
             super___uniq_ptr_impl<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_plugin::PluginManager_*,_std::default_delete<plugin::PluginManager>_>
             .super__Head_base<0UL,_plugin::PluginManager_*,_false>._M_head_impl);
  gtest_ar_2._0_4_ =
       (**(code **)(*(long *)sp.
                             super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 0x28))();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&sp2,"plugin::interfaces::IStatefulPluginInterface::DEFAULT_VALUE",
             "sp->GetNumber()",&plugin::interfaces::IStatefulPluginInterface::DEFAULT_VALUE,
             (int *)&gtest_ar_2);
  if ((char)sp2.
            super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    std::operator<<((ostream *)(CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 0x10),
                    "The initial value is not what was expected after reloading the plugins");
    if (sp2.
        super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x14c280;
    }
    else {
      pp_Var3 = (sp2.
                 super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x98,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sp2.
                    super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sp.
              super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&wp.
              super___weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>::~unique_ptr
            (&pm);
  return;
}

Assistant:

TEST(TestPluginManager, statefulPluginReload)
{
    auto pm = std::make_unique<plugin::PluginManager>("statefulplugintest.pb.txt");

    std::weak_ptr<plugin::interfaces::IStatefulPluginInterface> wp = plugin::helpers::GetSinglePlugin<plugin::interfaces::IStatefulPluginInterface>(*pm);

    { // artificial scope to ensure that the shared pointers go out of scope
        auto const sp = wp.lock();

        EXPECT_EQ(plugin::interfaces::IStatefulPluginInterface::DEFAULT_VALUE, sp->GetNumber()) << "The initial value is not what was expected";

        auto const testValue = 42;
        sp->SetNumber(testValue);
        EXPECT_EQ(testValue, sp->GetNumber()) << "The new value is not what was expected";

        auto const sp2 = plugin::helpers::GetSinglePlugin<plugin::interfaces::IStatefulPluginInterface>(*pm);
        EXPECT_EQ(sp.get(), sp2.get()) << "Getting the interface again does NOT return the same shared pointer";
        EXPECT_EQ(testValue, sp2->GetNumber()) << "Getting another pointer to the same interface does NOT give the same internal state";
    }

    EXPECT_FALSE(wp.expired()) << "The plugin object was deleted, but should still exist.";

    // Unload the plugins by deleting the plugin manager instance
    pm.reset();
    EXPECT_TRUE(wp.expired()) << "The plugin object WAS NOT deleted after unloading the plugin manager.";

    // Load a new plugin manager
    pm = std::make_unique<plugin::PluginManager>("statefulplugintest.pb.txt");

    // .. and make sure that it gives fresh interface instances
    auto const sp = plugin::helpers::GetSinglePlugin<plugin::interfaces::IStatefulPluginInterface>(*pm);
    EXPECT_EQ(plugin::interfaces::IStatefulPluginInterface::DEFAULT_VALUE, sp->GetNumber()) << "The initial value is not what was expected after reloading the plugins";
}